

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_fmax_a_df_mips64el
               (CPUMIPSState_conflict10 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float_status *status_00;
  int32_t *piVar1;
  byte bVar2;
  int iVar3;
  float32 fVar4;
  uint uVar5;
  uint uVar6;
  float32 fVar7;
  uint uVar8;
  float32 fVar9;
  float32 fVar10;
  float32 fVar11;
  float32 fVar12;
  float32 fVar13;
  fpr_t *pfVar14;
  float64 fVar15;
  float64 fVar16;
  uint uVar17;
  uint uVar18;
  fpr_t *pfVar19;
  uint uVar20;
  float64 fVar21;
  ulong uVar22;
  uint32_t unaff_retaddr;
  float_status *status;
  float64 local_68;
  ulong local_58;
  ulong local_50;
  
  status_00 = &(env->active_tc).msa_fp_status;
  pfVar19 = (env->active_fpu).fpr + ws;
  pfVar14 = (env->active_fpu).fpr + wt;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 3) {
    uVar22 = pfVar19->fd;
    fVar15 = pfVar14->fd;
    if ((((0x7ff0000000000000 < (uVar22 & 0x7fffffffffffffff)) ||
         (iVar3 = float64_is_quiet_nan_mips64el(fVar15,status_00), fVar21 = uVar22, iVar3 == 0)) &&
        (fVar21 = fVar15, (fVar15 & 0x7fffffffffffffff) < 0x7ff0000000000001)) &&
       (iVar3 = float64_is_quiet_nan_mips64el(uVar22,status_00), iVar3 != 0)) {
      uVar22 = fVar15;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    local_58 = float64_max_mips64el(uVar22,fVar21,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
    uVar18 = (env->active_tc).msacsr;
    uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar17 = 3;
    if ((uVar18 & 0x1000000) == 0) {
      uVar17 = uVar5;
    }
    if (-1 < (char)bVar2) {
      uVar17 = uVar5;
    }
    uVar17 = uVar17 | uVar20;
    uVar6 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
    uVar5 = uVar6 | uVar17;
    uVar20 = uVar20 & 0xfffffffc;
    if ((uVar6 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
      uVar20 = uVar5;
    }
    if ((uVar17 & 2) == 0) {
      uVar20 = uVar5;
    }
    if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
      uVar17 = uVar20 << 0xc;
LAB_00986d37:
      (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
    }
    else if ((uVar18 >> 0x12 & 1) == 0) {
      uVar17 = uVar20 << 0xc | uVar18;
      uVar18 = uVar18 & 0xfff80fff;
      goto LAB_00986d37;
    }
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
      fVar15 = float64_default_nan_mips64el(status_00);
      local_58 = (long)(int)uVar20 | fVar15 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    local_68 = float64_min_mips64el(uVar22,fVar21,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
    uVar18 = (env->active_tc).msacsr;
    uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar17 = 3;
    if ((uVar18 & 0x1000000) == 0) {
      uVar17 = uVar5;
    }
    if (-1 < (char)bVar2) {
      uVar17 = uVar5;
    }
    uVar17 = uVar17 | uVar20;
    uVar6 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
    uVar5 = uVar6 | uVar17;
    uVar20 = uVar20 & 0xfffffffc;
    if ((uVar6 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
      uVar20 = uVar5;
    }
    if ((uVar17 & 2) == 0) {
      uVar20 = uVar5;
    }
    if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
      uVar17 = uVar20 << 0xc;
LAB_00986e42:
      (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
    }
    else if ((uVar18 >> 0x12 & 1) == 0) {
      uVar17 = uVar20 << 0xc | uVar18;
      uVar18 = uVar18 & 0xfff80fff;
      goto LAB_00986e42;
    }
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
      fVar15 = float64_default_nan_mips64el(status_00);
      local_68 = (long)(int)uVar20 | fVar15 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar15 = float64_max_mips64el(uVar22 & 0x7fffffffffffffff,fVar21 & 0x7fffffffffffffff,status_00)
    ;
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
    uVar18 = (env->active_tc).msacsr;
    uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar17 = 3;
    if ((uVar18 & 0x1000000) == 0) {
      uVar17 = uVar5;
    }
    if (-1 < (char)bVar2) {
      uVar17 = uVar5;
    }
    uVar17 = uVar17 | uVar20;
    uVar6 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
    uVar5 = uVar6 | uVar17;
    uVar20 = uVar20 & 0xfffffffc;
    if ((uVar6 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
      uVar20 = uVar5;
    }
    if ((uVar17 & 2) == 0) {
      uVar20 = uVar5;
    }
    if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
      uVar17 = uVar20 << 0xc;
LAB_00986f4e:
      (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
    }
    else if ((uVar18 >> 0x12 & 1) == 0) {
      uVar17 = uVar20 << 0xc | uVar18;
      uVar18 = uVar18 & 0xfff80fff;
      goto LAB_00986f4e;
    }
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
      fVar15 = float64_default_nan_mips64el(status_00);
      fVar15 = (long)(int)uVar20 | fVar15 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    if (fVar15 == (local_58 & 0x7fffffffffffffff)) {
      local_68 = local_58;
    }
    if ((uVar22 & 0x7fffffffffffffff) == (fVar21 & 0x7fffffffffffffff)) {
      local_68 = local_58;
    }
    uVar22 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    fVar15 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    if (((0x7ff0000000000000 < (uVar22 & 0x7fffffffffffffff)) ||
        (iVar3 = float64_is_quiet_nan_mips64el(fVar15,status_00), fVar21 = uVar22, iVar3 == 0)) &&
       ((fVar21 = fVar15, (fVar15 & 0x7fffffffffffffff) < 0x7ff0000000000001 &&
        (iVar3 = float64_is_quiet_nan_mips64el(uVar22,status_00), iVar3 != 0)))) {
      uVar22 = fVar15;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    local_50 = float64_max_mips64el(uVar22,fVar21,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
    uVar18 = (env->active_tc).msacsr;
    uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar17 = 3;
    if ((uVar18 & 0x1000000) == 0) {
      uVar17 = uVar5;
    }
    if (-1 < (char)bVar2) {
      uVar17 = uVar5;
    }
    uVar17 = uVar17 | uVar20;
    uVar5 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
    uVar6 = uVar5 | uVar17;
    uVar20 = uVar20 & 0xfffffffc;
    if ((uVar5 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
      uVar20 = uVar6;
    }
    if ((uVar17 & 2) == 0) {
      uVar20 = uVar6;
    }
    if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
      uVar17 = uVar20 << 0xc;
LAB_009870dc:
      (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
    }
    else if ((uVar18 >> 0x12 & 1) == 0) {
      uVar17 = uVar20 << 0xc | uVar18;
      uVar18 = uVar18 & 0xfff80fff;
      goto LAB_009870dc;
    }
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
      fVar15 = float64_default_nan_mips64el(status_00);
      local_50 = (long)(int)uVar20 | fVar15 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar15 = float64_min_mips64el(uVar22,fVar21,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
    uVar18 = (env->active_tc).msacsr;
    uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar17 = 3;
    if ((uVar18 & 0x1000000) == 0) {
      uVar17 = uVar5;
    }
    if (-1 < (char)bVar2) {
      uVar17 = uVar5;
    }
    uVar17 = uVar17 | uVar20;
    uVar5 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
    uVar6 = uVar5 | uVar17;
    uVar20 = uVar20 & 0xfffffffc;
    if ((uVar5 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
      uVar20 = uVar6;
    }
    if ((uVar17 & 2) == 0) {
      uVar20 = uVar6;
    }
    if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
      uVar17 = uVar20 << 0xc;
LAB_009871e4:
      (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
    }
    else if ((uVar18 >> 0x12 & 1) == 0) {
      uVar17 = uVar20 << 0xc | uVar18;
      uVar18 = uVar18 & 0xfff80fff;
      goto LAB_009871e4;
    }
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
      fVar15 = float64_default_nan_mips64el(status_00);
      fVar15 = (long)(int)uVar20 | fVar15 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar16 = float64_max_mips64el(uVar22 & 0x7fffffffffffffff,fVar21 & 0x7fffffffffffffff,status_00)
    ;
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
    uVar18 = (env->active_tc).msacsr;
    uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar17 = 3;
    if ((uVar18 & 0x1000000) == 0) {
      uVar17 = uVar5;
    }
    if (-1 < (char)bVar2) {
      uVar17 = uVar5;
    }
    uVar17 = uVar17 | uVar20;
    uVar6 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
    uVar5 = uVar6 | uVar17;
    uVar20 = uVar20 & 0xfffffffc;
    if ((uVar6 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
      uVar20 = uVar5;
    }
    if ((uVar17 & 2) == 0) {
      uVar20 = uVar5;
    }
    if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
      uVar17 = uVar20 << 0xc;
LAB_0098730d:
      (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
    }
    else if ((uVar18 >> 0x12 & 1) == 0) {
      uVar17 = uVar20 << 0xc | uVar18;
      uVar18 = uVar18 & 0xfff80fff;
      goto LAB_0098730d;
    }
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
      fVar16 = float64_default_nan_mips64el(status_00);
      fVar16 = (long)(int)uVar20 | fVar16 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    if (fVar16 == (local_50 & 0x7fffffffffffffff)) {
      fVar15 = local_50;
    }
    if ((uVar22 & 0x7fffffffffffffff) == (fVar21 & 0x7fffffffffffffff)) {
      fVar15 = local_50;
    }
    goto LAB_0098808b;
  }
  if (df != 2) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x1ada,
                  "void helper_msa_fmax_a_df_mips64el(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  uVar18 = pfVar19->fs[0];
  fVar4 = pfVar14->fs[0];
  if (((0x7f800000 < (uVar18 & 0x7fffffff)) ||
      (iVar3 = float32_is_quiet_nan_mips64el(fVar4,status_00), fVar9 = uVar18, iVar3 == 0)) &&
     ((fVar9 = fVar4, (fVar4 & 0x7fffffff) < 0x7f800001 &&
      (iVar3 = float32_is_quiet_nan_mips64el(uVar18,status_00), iVar3 != 0)))) {
    uVar18 = fVar4;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar4 = float32_max_mips64el(uVar18,fVar9,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar5 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar17 = (env->active_tc).msacsr;
  uVar6 = (uint)(byte)((byte)((uVar17 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar20 = 3;
  if ((uVar17 & 0x1000000) == 0) {
    uVar20 = uVar6;
  }
  if (-1 < (char)bVar2) {
    uVar20 = uVar6;
  }
  uVar20 = uVar20 | uVar5;
  uVar8 = (uint)((uVar17 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
  uVar6 = uVar8 | uVar20;
  uVar5 = uVar5 & 0xfffffffc;
  if ((uVar8 != 0 || (uVar20 & 1) != 0) || (uVar17 & 0x100) != 0) {
    uVar5 = uVar6;
  }
  if ((uVar20 & 2) == 0) {
    uVar5 = uVar6;
  }
  if ((uVar5 & (uVar17 >> 7 & 0x1f | 0x20)) == 0) {
    uVar20 = uVar5 << 0xc;
LAB_00987381:
    (env->active_tc).msacsr = uVar20 & 0x3f000 | uVar17;
  }
  else if ((uVar17 >> 0x12 & 1) == 0) {
    uVar20 = uVar5 << 0xc | uVar17;
    uVar17 = uVar17 & 0xfff80fff;
    goto LAB_00987381;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
    fVar4 = float32_default_nan_mips64el(status_00);
    fVar4 = fVar4 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar7 = float32_min_mips64el(uVar18,fVar9,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar5 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar17 = (env->active_tc).msacsr;
  uVar6 = (uint)(byte)((byte)((uVar17 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar20 = 3;
  if ((uVar17 & 0x1000000) == 0) {
    uVar20 = uVar6;
  }
  if (-1 < (char)bVar2) {
    uVar20 = uVar6;
  }
  uVar20 = uVar20 | uVar5;
  uVar6 = (uint)((uVar17 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
  uVar8 = uVar6 | uVar20;
  uVar5 = uVar5 & 0xfffffffc;
  if ((uVar6 != 0 || (uVar20 & 1) != 0) || (uVar17 & 0x100) != 0) {
    uVar5 = uVar8;
  }
  if ((uVar20 & 2) == 0) {
    uVar5 = uVar8;
  }
  if ((uVar5 & (uVar17 >> 7 & 0x1f | 0x20)) == 0) {
    uVar20 = uVar5 << 0xc;
LAB_00987485:
    (env->active_tc).msacsr = uVar20 & 0x3f000 | uVar17;
  }
  else if ((uVar17 >> 0x12 & 1) == 0) {
    uVar20 = uVar5 << 0xc | uVar17;
    uVar17 = uVar17 & 0xfff80fff;
    goto LAB_00987485;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
    fVar7 = float32_default_nan_mips64el(status_00);
    fVar7 = fVar7 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  local_68._0_4_ = fVar9 & 0x7fffffff;
  fVar9 = float32_max_mips64el(uVar18 & 0x7fffffff,fVar9 & 0x7fffffff,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar5 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar17 = (env->active_tc).msacsr;
  uVar6 = (uint)(byte)((byte)((uVar17 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar20 = 3;
  if ((uVar17 & 0x1000000) == 0) {
    uVar20 = uVar6;
  }
  if (-1 < (char)bVar2) {
    uVar20 = uVar6;
  }
  uVar20 = uVar20 | uVar5;
  uVar8 = (uint)((uVar17 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
  uVar6 = uVar8 | uVar20;
  uVar5 = uVar5 & 0xfffffffc;
  if ((uVar8 != 0 || (uVar20 & 1) != 0) || (uVar17 & 0x100) != 0) {
    uVar5 = uVar6;
  }
  if ((uVar20 & 2) == 0) {
    uVar5 = uVar6;
  }
  if ((uVar5 & (uVar17 >> 7 & 0x1f | 0x20)) == 0) {
    uVar20 = uVar5 << 0xc;
LAB_00987595:
    (env->active_tc).msacsr = uVar20 & 0x3f000 | uVar17;
  }
  else if ((uVar17 >> 0x12 & 1) == 0) {
    uVar20 = uVar5 << 0xc | uVar17;
    uVar17 = uVar17 & 0xfff80fff;
    goto LAB_00987595;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
    fVar9 = float32_default_nan_mips64el(status_00);
    fVar9 = fVar9 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  if (fVar9 == (fVar4 & 0x7fffffff)) {
    fVar7 = fVar4;
  }
  if ((uVar18 & 0x7fffffff) == (uint)local_68) {
    fVar7 = fVar4;
  }
  fVar4 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  fVar9 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
  if ((((0x7f800000 < (fVar4 & 0x7fffffff)) ||
       (iVar3 = float32_is_quiet_nan_mips64el(fVar9,status_00), fVar11 = fVar4, iVar3 == 0)) &&
      (fVar11 = fVar9, (fVar9 & 0x7fffffff) < 0x7f800001)) &&
     (iVar3 = float32_is_quiet_nan_mips64el(fVar4,status_00), iVar3 != 0)) {
    fVar4 = fVar9;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar9 = float32_max_mips64el(fVar4,fVar11,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar18 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar17 = 3;
  if ((uVar18 & 0x1000000) == 0) {
    uVar17 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar17 = uVar5;
  }
  uVar17 = uVar17 | uVar20;
  uVar5 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar6 = uVar5 | uVar17;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar5 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
    uVar20 = uVar6;
  }
  if ((uVar17 & 2) == 0) {
    uVar20 = uVar6;
  }
  if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
    uVar17 = uVar20 << 0xc;
LAB_0098770d:
    (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
  }
  else if ((uVar18 >> 0x12 & 1) == 0) {
    uVar17 = uVar20 << 0xc | uVar18;
    uVar18 = uVar18 & 0xfff80fff;
    goto LAB_0098770d;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
    fVar9 = float32_default_nan_mips64el(status_00);
    fVar9 = fVar9 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar10 = float32_min_mips64el(fVar4,fVar11,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar18 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar17 = 3;
  if ((uVar18 & 0x1000000) == 0) {
    uVar17 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar17 = uVar5;
  }
  uVar17 = uVar17 | uVar20;
  uVar5 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar6 = uVar5 | uVar17;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar5 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
    uVar20 = uVar6;
  }
  if ((uVar17 & 2) == 0) {
    uVar20 = uVar6;
  }
  if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
    uVar17 = uVar20 << 0xc;
LAB_00987811:
    (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
  }
  else if ((uVar18 >> 0x12 & 1) == 0) {
    uVar17 = uVar20 << 0xc | uVar18;
    uVar18 = uVar18 & 0xfff80fff;
    goto LAB_00987811;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
    fVar10 = float32_default_nan_mips64el(status_00);
    fVar10 = fVar10 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  local_58._0_4_ = fVar11 & 0x7fffffff;
  fVar11 = float32_max_mips64el(fVar4 & 0x7fffffff,fVar11 & 0x7fffffff,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar18 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar17 = 3;
  if ((uVar18 & 0x1000000) == 0) {
    uVar17 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar17 = uVar5;
  }
  uVar17 = uVar17 | uVar20;
  uVar6 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar5 = uVar6 | uVar17;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar6 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
    uVar20 = uVar5;
  }
  if ((uVar17 & 2) == 0) {
    uVar20 = uVar5;
  }
  if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
    uVar17 = uVar20 << 0xc;
LAB_00987917:
    (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
  }
  else if ((uVar18 >> 0x12 & 1) == 0) {
    uVar17 = uVar20 << 0xc | uVar18;
    uVar18 = uVar18 & 0xfff80fff;
    goto LAB_00987917;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
    fVar11 = float32_default_nan_mips64el(status_00);
    fVar11 = fVar11 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  if (fVar11 == (fVar9 & 0x7fffffff)) {
    fVar10 = fVar9;
  }
  if ((fVar4 & 0x7fffffff) == (uint)local_58) {
    fVar10 = fVar9;
  }
  fVar4 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  fVar9 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  if (((0x7f800000 < (fVar4 & 0x7fffffff)) ||
      (iVar3 = float32_is_quiet_nan_mips64el(fVar9,status_00), fVar11 = fVar4, iVar3 == 0)) &&
     ((fVar11 = fVar9, (fVar9 & 0x7fffffff) < 0x7f800001 &&
      (iVar3 = float32_is_quiet_nan_mips64el(fVar4,status_00), iVar3 != 0)))) {
    fVar4 = fVar9;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar9 = float32_max_mips64el(fVar4,fVar11,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar18 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar17 = 3;
  if ((uVar18 & 0x1000000) == 0) {
    uVar17 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar17 = uVar5;
  }
  uVar17 = uVar17 | uVar20;
  uVar5 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar6 = uVar5 | uVar17;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar5 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
    uVar20 = uVar6;
  }
  if ((uVar17 & 2) == 0) {
    uVar20 = uVar6;
  }
  if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
    uVar17 = uVar20 << 0xc;
LAB_00987a95:
    (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
  }
  else if ((uVar18 >> 0x12 & 1) == 0) {
    uVar17 = uVar20 << 0xc | uVar18;
    uVar18 = uVar18 & 0xfff80fff;
    goto LAB_00987a95;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
    fVar9 = float32_default_nan_mips64el(status_00);
    fVar9 = fVar9 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar12 = float32_min_mips64el(fVar4,fVar11,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar18 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar17 = 3;
  if ((uVar18 & 0x1000000) == 0) {
    uVar17 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar17 = uVar5;
  }
  uVar17 = uVar17 | uVar20;
  uVar6 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar5 = uVar6 | uVar17;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar6 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
    uVar20 = uVar5;
  }
  if ((uVar17 & 2) == 0) {
    uVar20 = uVar5;
  }
  if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
    uVar17 = uVar20 << 0xc;
LAB_00987ba0:
    (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
  }
  else if ((uVar18 >> 0x12 & 1) == 0) {
    uVar17 = uVar20 << 0xc | uVar18;
    uVar18 = uVar18 & 0xfff80fff;
    goto LAB_00987ba0;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
    fVar12 = float32_default_nan_mips64el(status_00);
    fVar12 = fVar12 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar13 = float32_max_mips64el(fVar4 & 0x7fffffff,fVar11 & 0x7fffffff,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar18 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar17 = 3;
  if ((uVar18 & 0x1000000) == 0) {
    uVar17 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar17 = uVar5;
  }
  uVar17 = uVar17 | uVar20;
  uVar6 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar5 = uVar6 | uVar17;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar6 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
    uVar20 = uVar5;
  }
  if ((uVar17 & 2) == 0) {
    uVar20 = uVar5;
  }
  if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
    uVar17 = uVar20 << 0xc;
LAB_00987ca0:
    (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
  }
  else if ((uVar18 >> 0x12 & 1) == 0) {
    uVar17 = uVar20 << 0xc | uVar18;
    uVar18 = uVar18 & 0xfff80fff;
    goto LAB_00987ca0;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
    fVar13 = float32_default_nan_mips64el(status_00);
    fVar13 = fVar13 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  if (fVar13 == (fVar9 & 0x7fffffff)) {
    fVar12 = fVar9;
  }
  if ((fVar4 & 0x7fffffff) == (fVar11 & 0x7fffffff)) {
    fVar12 = fVar9;
  }
  fVar4 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  fVar9 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  if (((0x7f800000 < (fVar4 & 0x7fffffff)) ||
      (iVar3 = float32_is_quiet_nan_mips64el(fVar9,status_00), fVar11 = fVar4, iVar3 == 0)) &&
     ((fVar11 = fVar9, (fVar9 & 0x7fffffff) < 0x7f800001 &&
      (iVar3 = float32_is_quiet_nan_mips64el(fVar4,status_00), iVar3 != 0)))) {
    fVar4 = fVar9;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar9 = float32_max_mips64el(fVar4,fVar11,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar18 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar17 = 3;
  if ((uVar18 & 0x1000000) == 0) {
    uVar17 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar17 = uVar5;
  }
  uVar17 = uVar17 | uVar20;
  uVar5 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar6 = uVar5 | uVar17;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar5 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
    uVar20 = uVar6;
  }
  if ((uVar17 & 2) == 0) {
    uVar20 = uVar6;
  }
  if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
    uVar17 = uVar20 << 0xc;
LAB_00987e0c:
    (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
  }
  else if ((uVar18 >> 0x12 & 1) == 0) {
    uVar17 = uVar20 << 0xc | uVar18;
    uVar18 = uVar18 & 0xfff80fff;
    goto LAB_00987e0c;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
    fVar9 = float32_default_nan_mips64el(status_00);
    fVar9 = fVar9 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  fVar13 = float32_min_mips64el(fVar4,fVar11,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar18 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar17 = 3;
  if ((uVar18 & 0x1000000) == 0) {
    uVar17 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar17 = uVar5;
  }
  uVar17 = uVar17 | uVar20;
  uVar6 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar5 = uVar6 | uVar17;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar6 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
    uVar20 = uVar5;
  }
  if ((uVar17 & 2) == 0) {
    uVar20 = uVar5;
  }
  if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
    uVar17 = uVar20 << 0xc;
LAB_00987f04:
    (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
  }
  else if ((uVar18 >> 0x12 & 1) == 0) {
    uVar17 = uVar20 << 0xc | uVar18;
    uVar18 = uVar18 & 0xfff80fff;
    goto LAB_00987f04;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
    fVar13 = float32_default_nan_mips64el(status_00);
    fVar13 = fVar13 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  local_50._0_4_ = fVar11 & 0x7fffffff;
  fVar11 = float32_max_mips64el(fVar4 & 0x7fffffff,fVar11 & 0x7fffffff,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar20 = ieee_ex_to_mips_mips64el((uint)bVar2);
  uVar18 = (env->active_tc).msacsr;
  uVar5 = (uint)(byte)((byte)((uVar18 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar17 = 3;
  if ((uVar18 & 0x1000000) == 0) {
    uVar17 = uVar5;
  }
  if (-1 < (char)bVar2) {
    uVar17 = uVar5;
  }
  uVar17 = uVar17 | uVar20;
  uVar6 = (uint)((uVar18 >> 9 & 1) == 0 & (byte)uVar20 >> 2);
  uVar5 = uVar6 | uVar17;
  uVar20 = uVar20 & 0xfffffffc;
  if ((uVar6 != 0 || (uVar17 & 1) != 0) || (uVar18 & 0x100) != 0) {
    uVar20 = uVar5;
  }
  if ((uVar17 & 2) == 0) {
    uVar20 = uVar5;
  }
  if ((uVar20 & (uVar18 >> 7 & 0x1f | 0x20)) == 0) {
    uVar17 = uVar20 << 0xc;
LAB_00988022:
    (env->active_tc).msacsr = uVar17 & 0x3f000 | uVar18;
  }
  else if ((uVar18 >> 0x12 & 1) == 0) {
    uVar17 = uVar20 << 0xc | uVar18;
    uVar18 = uVar18 & 0xfff80fff;
    goto LAB_00988022;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar20) != 0) {
    fVar11 = float32_default_nan_mips64el(status_00);
    fVar11 = fVar11 & 0xffffffc0 ^ 0x400000 | uVar20;
  }
  local_68 = CONCAT44(fVar10,fVar7);
  if (fVar11 == (fVar9 & 0x7fffffff)) {
    fVar13 = fVar9;
  }
  if ((fVar4 & 0x7fffffff) == (uint)local_50) {
    fVar13 = fVar9;
  }
  fVar15 = CONCAT44(fVar13,fVar12);
LAB_0098808b:
  uVar18 = (env->active_tc).msacsr;
  uVar17 = uVar18 >> 7 & 0x1f | 0x20;
  if ((uVar17 & uVar18 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar17);
  }
  (env->active_tc).msacsr = (uVar18 >> 0xc & 0x1f) << 2 | uVar18;
  (env->active_fpu).fpr[wd].fd = local_68;
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = fVar15;
  return;
}

Assistant:

void helper_msa_fmax_a_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
    float_status *status = &env->active_tc.msa_fp_status;
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    clear_msacsr_cause(env);

    if (df == DF_WORD) {
        FMAXMIN_A(max, min, pwx->w[0], pws->w[0], pwt->w[0], 32, status);
        FMAXMIN_A(max, min, pwx->w[1], pws->w[1], pwt->w[1], 32, status);
        FMAXMIN_A(max, min, pwx->w[2], pws->w[2], pwt->w[2], 32, status);
        FMAXMIN_A(max, min, pwx->w[3], pws->w[3], pwt->w[3], 32, status);
    } else if (df == DF_DOUBLE) {
        FMAXMIN_A(max, min, pwx->d[0], pws->d[0], pwt->d[0], 64, status);
        FMAXMIN_A(max, min, pwx->d[1], pws->d[1], pwt->d[1], 64, status);
    } else {
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}